

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

QByteArray * __thiscall
QByteArray::replace(QByteArray *this,qsizetype pos,qsizetype len,QByteArrayView after)

{
  QByteArrayView after_00;
  bool bVar1;
  const_pointer pvVar2;
  size_t sVar3;
  long lVar4;
  qsizetype qVar5;
  char *pcVar6;
  storage_type *in_RCX;
  size_t in_RDX;
  QByteArray *in_RSI;
  QArrayDataPointer<char> *in_RDI;
  long in_FS_OFFSET;
  QVarLengthArray<char,_256LL> copy;
  QVarLengthArray<char,_256LL> *in_stack_fffffffffffffe10;
  QVarLengthArray<char,_256LL> *in_stack_fffffffffffffe18;
  QByteArrayView *in_stack_fffffffffffffe20;
  QArrayDataPointer<char> *in_stack_fffffffffffffe38;
  QByteArrayView *this_00;
  char **in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe58;
  QVarLengthArray<char,_256LL> *in_stack_fffffffffffffe60;
  qsizetype in_stack_fffffffffffffe68;
  qsizetype in_stack_fffffffffffffe80;
  size_t __n;
  QArrayDataPointer<char> *local_160;
  QByteArrayView in_stack_fffffffffffffeb8;
  char local_120 [280];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar2 = QByteArrayView::data((QByteArrayView *)&stack0xfffffffffffffed0);
  bVar1 = QtPrivate::q_points_into_range<QArrayDataPointer<char>,char_const*>
                    (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  if (bVar1) {
    pcVar6 = local_120;
    memset(pcVar6,0xaa,0x118);
    this_00 = (QByteArrayView *)&stack0xfffffffffffffed0;
    QByteArrayView::data(this_00);
    QByteArrayView::data(this_00);
    QByteArrayView::size(this_00);
    QVarLengthArray<char,_256LL>::QVarLengthArray<const_char_*,_true>
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,pcVar6);
    QByteArrayView::QByteArrayView<QVarLengthArray<char,_256LL>,_true>
              (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    after_00.m_data = in_RCX;
    after_00.m_size = (qsizetype)pvVar2;
    local_160 = &replace(in_RSI,in_RDX,in_stack_fffffffffffffe80,after_00)->d;
    QVarLengthArray<char,_256LL>::~QVarLengthArray(in_stack_fffffffffffffe10);
  }
  else {
    __n = in_RDX;
    sVar3 = QByteArrayView::size((QByteArrayView *)&stack0xfffffffffffffed0);
    if ((in_RDX == sVar3) &&
       (lVar4 = (long)&(in_RSI->d).d + __n, qVar5 = size((QByteArray *)in_RDI), lVar4 <= qVar5)) {
      local_160 = in_RDI;
      if (0 < (long)__n) {
        detach((QByteArray *)in_stack_fffffffffffffe10);
        pcVar6 = QArrayDataPointer<char>::data(in_RDI);
        pcVar6 = pcVar6 + (long)in_RSI;
        pvVar2 = QByteArrayView::data((QByteArrayView *)&stack0xfffffffffffffed0);
        memcpy(pcVar6,pvVar2,__n);
        local_160 = in_RDI;
      }
    }
    else {
      remove((QByteArray *)in_RDI,(char *)in_RSI);
      local_160 = &insert((QByteArray *)in_RDI,in_stack_fffffffffffffe68,in_stack_fffffffffffffeb8)
                   ->d;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QByteArray *)local_160;
}

Assistant:

QByteArray &QByteArray::replace(qsizetype pos, qsizetype len, QByteArrayView after)
{
    if (QtPrivate::q_points_into_range(after.data(), d)) {
        QVarLengthArray copy(after.data(), after.data() + after.size());
        return replace(pos, len, QByteArrayView{copy});
    }
    if (len == after.size() && (pos + len <= size())) {
        // same size: in-place replacement possible
        if (len > 0) {
            detach();
            memcpy(d.data() + pos, after.data(), len*sizeof(char));
        }
        return *this;
    } else {
        // ### optimize me
        remove(pos, len);
        return insert(pos, after);
    }
}